

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void ParseHTMLWithNode(TidyDocImpl *doc,Node *node)

{
  int iVar1;
  TidyParserMemory *pTVar2;
  Parser *pPVar3;
  long lVar4;
  GetTokenMode mode;
  
  pPVar3 = GetParserForNode(doc,node);
  mode = IgnoreWhitespace;
LAB_001386b5:
  while( true ) {
    if (pPVar3 == (Parser *)0x0) {
      node = (Node *)0x0;
    }
    else {
      node = (*pPVar3)(doc,node,mode);
    }
    if (node == (Node *)0x0) break;
    pPVar3 = GetParserForNode(doc,node);
  }
  iVar1 = (doc->stack).top;
  lVar4 = (long)iVar1;
  if (-1 < lVar4) goto code_r0x001386ef;
  goto LAB_0013871d;
code_r0x001386ef:
  pTVar2 = (doc->stack).content;
  pPVar3 = pTVar2[lVar4].identity;
  node = (Node *)0x0;
  if (pPVar3 == (Parser *)0x0) {
    mode = pTVar2[lVar4].mode;
    (doc->stack).top = iVar1 + -1;
LAB_0013871d:
    node = prvTidyGetToken(doc,mode);
    if (node == (Node *)0x0) {
      return;
    }
    pPVar3 = GetParserForNode(doc,node);
  }
  goto LAB_001386b5;
}

Assistant:

void ParseHTMLWithNode( TidyDocImpl* doc, Node* node )
{
    GetTokenMode mode = IgnoreWhitespace;
    Parser* parser = GetParserForNode( doc, node );
    Bool something_to_do = yes;

    /*
     This main loop is only extinguished when all of the parser tokens are
     consumed. Ideally, EVERY parser will return nodes to this loop for
     dispatch to the appropriate parser, but some of the recursive parsers
     still consume some tokens on their own.
     */
    while (something_to_do)
    {
        node = parser ? parser( doc, node, mode ) : NULL;
        
        /*
         We have a node, so anything deferred was already pushed to the stack
         to be dealt with later.
         */
        if ( node )
        {
            parser = GetParserForNode( doc, node );
            continue;
        }

        /*
         We weren't given a node, which means this particular leaf is bottomed
         out. We'll re-enter the parsers using information from the stack.
         */
        if ( !TY_(isEmptyParserStack)(doc))
        {
            parser = TY_(peekMemoryIdentity)(doc);
            if (parser)
            {
                continue;
            }
            else
            {
                /* No parser means we're only passing back a parsing mode. */
                mode = TY_(peekMemoryMode)( doc );
                TY_(popMemory)( doc );
            }
        }
        
        /*
         At this point, there's nothing being returned from parsers, and
         nothing on the stack, so we can draw a new node from the lexer.
         */
        node = TY_(GetToken)( doc, mode );
        DEBUG_LOG_GOT_TOKEN(node);

        if (node)
            parser = GetParserForNode( doc, node );
        else
            something_to_do = no;
    }
}